

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O0

Sfm_Ntk_t * Abc_NtkExtractMfs2(Abc_Ntk_t *pNtk,int iPivot)

{
  char *pcVar1;
  Vec_Str_t *vFanins_00;
  int iVar2;
  int iVar3;
  int iVar4;
  word Entry;
  word *pRes_00;
  Vec_Int_t *pVVar5;
  Sfm_Ntk_t *pSVar6;
  word *pRes;
  int Offset;
  int nWords;
  word uTruth;
  int nTotal;
  int nObjs;
  int k;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Vec_Wrd_t *vTruths2;
  Vec_Int_t *vStarts;
  Vec_Int_t *vArray;
  Vec_Wrd_t *vTruths;
  Vec_Str_t *vFixed;
  Vec_Wec_t *vFanins;
  Vec_Ptr_t *vNodes;
  word pCube [1024];
  word *pTruths [16];
  word TruthStore [16] [1024];
  int iPivot_local;
  Abc_Ntk_t *pNtk_local;
  
  memset(pTruths + 0xf,0,0x20000);
  memset(pCube + 0x3ff,0,0x80);
  memset(&vNodes,0,0x2000);
  uTruth._0_4_ = 0;
  vFanins = (Vec_Wec_t *)Abc_NtkAssignIDs2(pNtk);
  iVar2 = Abc_NtkCiNum(pNtk);
  iVar3 = Vec_PtrSize((Vec_Ptr_t *)vFanins);
  iVar4 = Abc_NtkCoNum(pNtk);
  uTruth._4_4_ = iVar2 + iVar3 + iVar4;
  vFixed = (Vec_Str_t *)Vec_WecStart(uTruth._4_4_);
  vTruths = (Vec_Wrd_t *)Vec_StrStart(uTruth._4_4_);
  vArray = (Vec_Int_t *)Vec_WrdStart(uTruth._4_4_);
  vTruths2 = (Vec_Wrd_t *)Abc_NtkAssignStarts(pNtk,(Vec_Ptr_t *)vFanins,(int *)&uTruth);
  pObj = (Abc_Obj_t *)Vec_WrdAlloc((int)uTruth);
  Abc_NtkFillTruthStore((word (*) [1024])(pTruths + 0xf));
  for (nObjs = 0; nObjs < 0x10; nObjs = nObjs + 1) {
    pCube[(long)nObjs + 0x3ff] = (word)(TruthStore[(long)nObjs + -1] + 0x3ff);
  }
  nObjs = 0;
  do {
    iVar2 = nObjs;
    iVar3 = Vec_PtrSize((Vec_Ptr_t *)vFanins);
    if (iVar3 <= iVar2) {
      for (nObjs = 0; iVar2 = nObjs, iVar3 = Abc_NtkCoNum(pNtk), iVar2 < iVar3; nObjs = nObjs + 1) {
        pFanin = Abc_NtkCo(pNtk,nObjs);
        pVVar5 = Vec_WecEntry((Vec_Wec_t *)vFixed,(pFanin->field_6).iTemp);
        vStarts = pVVar5;
        iVar2 = Abc_ObjFaninNum(pFanin);
        Vec_IntGrow(pVVar5,iVar2);
        for (nTotal = 0; iVar2 = nTotal, iVar3 = Abc_ObjFaninNum(pFanin), iVar2 < iVar3;
            nTotal = nTotal + 1) {
          _k = Abc_ObjFanin(pFanin,nTotal);
          Vec_IntPush(vStarts,(_k->field_6).iTemp);
        }
      }
      Vec_PtrFree((Vec_Ptr_t *)vFanins);
      for (nObjs = 0; iVar2 = nObjs, iVar3 = Vec_PtrSize(pNtk->vObjs), vFanins_00 = vFixed,
          iVar2 < iVar3; nObjs = nObjs + 1) {
        pFanin = Abc_NtkObj(pNtk,nObjs);
        if (((pFanin != (Abc_Obj_t *)0x0) && (iVar2 = Abc_ObjIsNode(pFanin), iVar2 != 0)) &&
           (iPivot <= nObjs)) {
          Vec_StrWriteEntry((Vec_Str_t *)vTruths,(pFanin->field_6).iTemp,'\x01');
        }
      }
      iVar2 = Abc_NtkCiNum(pNtk);
      iVar3 = Abc_NtkCoNum(pNtk);
      pSVar6 = Sfm_NtkConstruct((Vec_Wec_t *)vFanins_00,iVar2,iVar3,(Vec_Str_t *)vTruths,
                                (Vec_Str_t *)0x0,(Vec_Wrd_t *)vArray,(Vec_Int_t *)vTruths2,
                                (Vec_Wrd_t *)pObj);
      return pSVar6;
    }
    pFanin = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)vFanins,nObjs);
    iVar2 = Abc_ObjFaninNum(pFanin);
    if (iVar2 < 7) {
      pcVar1 = (char *)(pFanin->field_5).pData;
      iVar2 = Abc_ObjFaninNum(pFanin);
      Entry = Abc_SopToTruth(pcVar1,iVar2);
      Vec_WrdWriteEntry((Vec_Wrd_t *)vArray,(pFanin->field_6).iTemp,Entry);
      if ((Entry != 0) && (Entry != 0xffffffffffffffff)) {
LAB_00335921:
        pVVar5 = Vec_WecEntry((Vec_Wec_t *)vFixed,(pFanin->field_6).iTemp);
        vStarts = pVVar5;
        iVar2 = Abc_ObjFaninNum(pFanin);
        Vec_IntGrow(pVVar5,iVar2);
        for (nTotal = 0; iVar2 = nTotal, iVar3 = Abc_ObjFaninNum(pFanin), iVar2 < iVar3;
            nTotal = nTotal + 1) {
          _k = Abc_ObjFanin(pFanin,nTotal);
          Vec_IntPush(vStarts,(_k->field_6).iTemp);
        }
      }
    }
    else {
      iVar2 = Abc_ObjFaninNum(pFanin);
      iVar2 = Abc_Truth6WordNum(iVar2);
      iVar3 = Vec_IntEntry((Vec_Int_t *)vTruths2,(pFanin->field_6).iTemp);
      pRes_00 = Vec_WrdEntryP((Vec_Wrd_t *)pObj,iVar3);
      pcVar1 = (char *)(pFanin->field_5).pData;
      iVar3 = Abc_ObjFaninNum(pFanin);
      Abc_SopToTruthBig(pcVar1,iVar3,(word **)(pCube + 0x3ff),(word *)&vNodes,pRes_00);
      for (nTotal = 0; (nTotal < iVar2 && (pRes_00[nTotal] == 0)); nTotal = nTotal + 1) {
      }
      if (nTotal != iVar2) {
        for (nTotal = 0; (nTotal < iVar2 && (pRes_00[nTotal] == 0xffffffffffffffff));
            nTotal = nTotal + 1) {
        }
        if (nTotal != iVar2) goto LAB_00335921;
      }
    }
    nObjs = nObjs + 1;
  } while( true );
}

Assistant:

Sfm_Ntk_t * Abc_NtkExtractMfs2( Abc_Ntk_t * pNtk, int iPivot )
{
    word TruthStore[16][1<<10] = {{0}}, * pTruths[16] = {NULL}, pCube[1<<10] = {0};
    Vec_Ptr_t * vNodes;
    Vec_Wec_t * vFanins;
    Vec_Str_t * vFixed;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vArray;
    Vec_Int_t * vStarts;
    Vec_Wrd_t * vTruths2;
    Abc_Obj_t * pObj, * pFanin;
    int i, k, nObjs, nTotal = 0;
    vNodes  = Abc_NtkAssignIDs2(pNtk);
    nObjs   = Abc_NtkCiNum(pNtk) + Vec_PtrSize(vNodes) + Abc_NtkCoNum(pNtk);
    vFanins = Vec_WecStart( nObjs );
    vFixed  = Vec_StrStart( nObjs );
    vTruths = Vec_WrdStart( nObjs );
    vStarts = Abc_NtkAssignStarts( pNtk, vNodes, &nTotal );
    vTruths2= Vec_WrdAlloc( nTotal );
    Abc_NtkFillTruthStore( TruthStore );
    for ( i = 0; i < 16; i++ )
        pTruths[i] = TruthStore[i];
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        if ( Abc_ObjFaninNum(pObj) <= 6 )
        {
            word uTruth = Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj));
            Vec_WrdWriteEntry( vTruths, pObj->iTemp, uTruth );
            if ( uTruth == 0 || ~uTruth == 0 )
                continue;
        }
        else
        {
            int nWords  = Abc_Truth6WordNum( Abc_ObjFaninNum(pObj) );
            int Offset  = Vec_IntEntry( vStarts, pObj->iTemp );
            word * pRes = Vec_WrdEntryP( vTruths2, Offset );
            Abc_SopToTruthBig( (char *)pObj->pData, Abc_ObjFaninNum(pObj), pTruths, pCube, pRes );
            // check const0
            for ( k = 0; k < nWords; k++ )
                if ( pRes[k] )
                    break;
            if ( k == nWords )
                continue;
            // check const1
            for ( k = 0; k < nWords; k++ )
                if ( ~pRes[k] )
                    break;
            if ( k == nWords )
                continue;
        }
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        vArray = Vec_WecEntry( vFanins, pObj->iTemp );
        Vec_IntGrow( vArray, Abc_ObjFaninNum(pObj) );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vArray, pFanin->iTemp );
    }
    Vec_PtrFree( vNodes );
    // set fixed attributes
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( i >= iPivot )
            Vec_StrWriteEntry( vFixed, pObj->iTemp, (char)1 );
    return Sfm_NtkConstruct( vFanins, Abc_NtkCiNum(pNtk), Abc_NtkCoNum(pNtk), vFixed, NULL, vTruths, vStarts, vTruths2 );
}